

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::remove_falsified_literals(Internal *this,Clause *c)

{
  int64_t *piVar1;
  int lit;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  Clause *pCVar7;
  
  lVar5 = (long)c->size * 4;
  uVar4 = 0;
  for (lVar6 = 0; (uVar4 < 2 && (lVar5 != lVar6)); lVar6 = lVar6 + 4) {
    uVar2 = fixed(this,*(int *)((long)&c[1].field_0 + lVar6));
    uVar4 = uVar4 - ((int)~uVar2 >> 0x1f);
  }
  if (1 < uVar4) {
    if (this->proof != (Proof *)0x0) {
      Proof::flush_clause(this->proof,c);
    }
    pCVar7 = c + 1;
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 4) {
      lit = *(int *)((long)&c[1].field_0 + lVar6);
      *(int *)&pCVar7->field_0 = lit;
      uVar4 = fixed(this,lit);
      pCVar7 = (Clause *)((long)&pCVar7->field_0 + (ulong)(~uVar4 >> 0x1f) * 4);
    }
    sVar3 = shrink_clause(this,c,(int)((ulong)((long)pCVar7 - (long)(c + 1)) >> 2));
    piVar1 = &(this->stats).collected;
    *piVar1 = *piVar1 + sVar3;
  }
  return;
}

Assistant:

void Internal::remove_falsified_literals (Clause *c) {
  const const_literal_iterator end = c->end ();
  const_literal_iterator i;
  int num_non_false = 0;
  for (i = c->begin (); num_non_false < 2 && i != end; i++)
    if (fixed (*i) >= 0)
      num_non_false++;
  if (num_non_false < 2)
    return;
  if (proof)
    proof->flush_clause (c);
  literal_iterator j = c->begin ();
  for (i = j; i != end; i++) {
    const int lit = *j++ = *i, tmp = fixed (lit);
    assert (tmp <= 0);
    if (tmp >= 0)
      continue;
    LOG ("flushing %d", lit);
    j--;
  }
  stats.collected += shrink_clause (c, j - c->begin ());
}